

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncpy_s.c
# Opt level: O3

errno_t strncpy_s(char *dest,rsize_t dmax,char *src,rsize_t slen)

{
  char cVar1;
  rsize_t rVar2;
  errno_t error;
  errno_t eVar3;
  char *msg;
  
  if (dest == (char *)0x0) {
    msg = "strncpy_s: dest is null";
LAB_00111388:
    eVar3 = 400;
    error = 400;
  }
  else {
    if (dmax == 0) {
      msg = "strncpy_s: dmax is 0";
LAB_0011139d:
      eVar3 = 0x191;
      error = 0x191;
      goto LAB_001113a9;
    }
    if (dmax < 0x1001) {
      if (src == (char *)0x0) {
        *dest = '\0';
        msg = "strncpy_s: src is null";
        goto LAB_00111388;
      }
      if (slen == 0) {
        *dest = '\0';
        msg = "strncpy_s: slen is zero";
        goto LAB_0011139d;
      }
      if (slen < 0x1001) {
        rVar2 = 0;
        if (dest < src) {
          do {
            if (dest + rVar2 == src) goto LAB_00111451;
            if (slen == rVar2) {
LAB_0011146c:
              dest[rVar2] = '\0';
              return 0;
            }
            cVar1 = src[rVar2];
            dest[rVar2] = cVar1;
            if (cVar1 == '\0') {
              return 0;
            }
            rVar2 = rVar2 + 1;
          } while (dmax != rVar2);
        }
        else {
          do {
            if (src + rVar2 == dest) goto LAB_00111451;
            if (slen == rVar2) goto LAB_0011146c;
            cVar1 = src[rVar2];
            dest[rVar2] = cVar1;
            if (cVar1 == '\0') {
              return 0;
            }
            rVar2 = rVar2 + 1;
          } while (dmax != rVar2);
        }
        *dest = '\0';
        msg = "strncpy_s: not enough space for src";
        eVar3 = 0x196;
        error = 0x196;
        goto LAB_001113a9;
      }
      *dest = '\0';
      msg = "strncpy_s: slen exceeds max";
    }
    else {
      msg = "strncpy_s: dmax exceeds max";
    }
    eVar3 = 0x193;
    error = 0x193;
  }
LAB_001113a9:
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
  return eVar3;
LAB_00111451:
  *dest = '\0';
  msg = "strncpy_s: overlapping objects";
  eVar3 = 0x194;
  error = 0x194;
  goto LAB_001113a9;
}

Assistant:

errno_t
strncpy_s (char *dest, rsize_t dmax, const char *src, rsize_t slen)
{
    rsize_t orig_dmax;
    char *orig_dest;
    const char *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strncpy_s: dest is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strncpy_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strncpy_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    /* hold base in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (src == NULL) {
        handle_error(orig_dest, orig_dmax, "strncpy_s: "
                     "src is null",
                     ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (slen == 0) {
        handle_error(orig_dest, orig_dmax, "strncpy_s: "
                     "slen is zero",
                     ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (slen > RSIZE_MAX_STR) {
        handle_error(orig_dest, orig_dmax, "strncpy_s: "
                     "slen exceeds max",
                     ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }


   if (dest < src) {
       overlap_bumper = src;

        while (dmax > 0) {
            if (dest == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strncpy_s: "
                        "overlapping objects",
                        ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

	    if (slen == 0) {
                /*
                 * Copying truncated to slen chars.  Note that the TR says to
                 * copy slen chars plus the null char.  We null the slack.
                 */
#ifdef SAFECLIB_STR_NULL_SLACK
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#else
                *dest = '\0';
#endif
                return RCNEGATE(EOK);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            slen--;
            dest++;
            src++;
        }

    } else {
        overlap_bumper = dest;

        while (dmax > 0) {
            if (src == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strncpy_s: "
                        "overlapping objects",
                        ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

	    if (slen == 0) {
                /*
                 * Copying truncated to slen chars.  Note that the TR says to
                 * copy slen chars plus the null char.  We null the slack.
                 */
#ifdef SAFECLIB_STR_NULL_SLACK
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#else
                *dest = '\0';
#endif
                return RCNEGATE(EOK);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            slen--;
            dest++;
            src++;
        }
    }

    /*
     * the entire src was not copied, so zero the string
     */
    handle_error(orig_dest, orig_dmax, "strncpy_s: not enough "
                 "space for src",
                 ESNOSPC);
    return RCNEGATE(ESNOSPC);
}